

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O0

c_float vec_scaled_norm_inf(c_float *S,c_float *v,c_int l)

{
  double local_38;
  c_float max;
  c_float abs_Sv_i;
  c_int i;
  c_int l_local;
  c_float *v_local;
  c_float *S_local;
  
  max = 0.0;
  for (i = 0; i < l; i = i + 1) {
    if (0.0 <= S[i] * v[i]) {
      local_38 = S[i] * v[i];
    }
    else {
      local_38 = -(S[i] * v[i]);
    }
    if (max < local_38) {
      max = local_38;
    }
  }
  return max;
}

Assistant:

c_float vec_scaled_norm_inf(const c_float *S, const c_float *v, c_int l) {
  c_int   i;
  c_float abs_Sv_i;
  c_float max = 0.0;

  for (i = 0; i < l; i++) {
    abs_Sv_i = c_absval(S[i] * v[i]);

    if (abs_Sv_i > max) max = abs_Sv_i;
  }
  return max;
}